

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O0

int __thiscall soplex::SPxParMultPR<double>::selectLeave(SPxParMultPR<double> *this)

{
  double *pdVar1;
  VectorBase<double> *this_00;
  long in_RDI;
  double best;
  double x;
  int n;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  this_00 = (VectorBase<double> *)((ulong)*(double *)(in_RDI + 0x18) ^ 0x8000000000000000);
  local_10 = -1;
  local_c = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2b0845);
  while (local_c = local_c + -1, -1 < local_c) {
    SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    pdVar1 = VectorBase<double>::operator[](this_00,(int)((ulong)in_RDI >> 0x20));
    if (*pdVar1 < (double)this_00) {
      local_10 = local_c;
      SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
      pdVar1 = VectorBase<double>::operator[](this_00,(int)((ulong)in_RDI >> 0x20));
      this_00 = (VectorBase<double> *)*pdVar1;
    }
  }
  return local_10;
}

Assistant:

int SPxParMultPR<R>::selectLeave()
{
   int i, n;
   R x;
   R best = -this->thetolerance;
   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   assert(this->thesolver != nullptr);
   n = -1;

   for(i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->fTest()[i];

      // x *= EQ_PREF * (1 + (up[i] == low[i]));
      if(x < best)
      {
         n = i;
         best = this->thesolver->fTest()[i];
      }
   }

   return n;
}